

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  char **ppcVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  sqlite3 *db;
  Table *pTVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  char **data;
  char **ppcVar10;
  uint uVar11;
  RenameToken *pRVar12;
  long lVar13;
  ulong uVar14;
  u64 n;
  char *pcVar15;
  char *pcVar16;
  
  db = pParse->db;
  pTVar6 = pParse->pNewTable;
  if ((pTVar6 == (Table *)0x0) || (pParse->eParseMode == '\x01')) {
LAB_001564eb:
    if (pFromCol != (ExprList *)0x0) {
LAB_001564f0:
      exprListDeleteNN(db,pFromCol);
    }
  }
  else {
    if (pFromCol != (ExprList *)0x0) {
      uVar11 = pFromCol->nExpr;
      if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == uVar11)) goto LAB_00156569;
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
      goto LAB_001564f0;
    }
    if (0 < pTVar6->nCol) {
      uVar11 = 1;
      if ((pToCol != (ExprList *)0x0) && (pToCol->nExpr != 1)) {
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar6->aCol[(ushort)pTVar6->nCol - 1].zCnName,pTo);
        goto LAB_00156500;
      }
LAB_00156569:
      n = (long)(int)uVar11 * 0x10 + (ulong)pTo->n + 0x41;
      if ((pToCol != (ExprList *)0x0) && (iVar5 = pToCol->nExpr, 0 < (long)iVar5)) {
        lVar13 = 0;
        do {
          pcVar15 = *(char **)((long)&pToCol->a[0].zEName + lVar13);
          if (pcVar15 == (char *)0x0) {
            lVar9 = 1;
          }
          else {
            sVar8 = strlen(pcVar15);
            lVar9 = (ulong)((uint)sVar8 & 0x3fffffff) + 1;
          }
          n = n + lVar9;
          lVar13 = lVar13 + 0x18;
        } while ((long)iVar5 * 0x18 != lVar13);
      }
      data = (char **)sqlite3DbMallocZero(db,n);
      if (data != (char **)0x0) {
        *data = (char *)pTVar6;
        data[1] = (char *)(pTVar6->u).tab.pFKey;
        ppcVar10 = data + (long)(int)uVar11 * 2 + 8;
        data[2] = (char *)ppcVar10;
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenMap(pParse,ppcVar10,pTo);
        }
        ppcVar1 = data + 8;
        memcpy(ppcVar10,pTo->z,(ulong)pTo->n);
        *(undefined1 *)((long)ppcVar10 + (ulong)pTo->n) = 0;
        sqlite3Dequote((char *)ppcVar10);
        uVar7 = pTo->n;
        *(uint *)(data + 5) = uVar11;
        if (pFromCol == (ExprList *)0x0) {
          *(int *)ppcVar1 = pTVar6->nCol + -1;
LAB_00156765:
          if (0 < (int)uVar11 && pToCol != (ExprList *)0x0) {
            pcVar15 = (char *)((long)ppcVar10 + (ulong)(uVar7 + 1));
            uVar14 = 0;
            do {
              pcVar16 = pToCol->a[uVar14].zEName;
              uVar7 = 0;
              if (pcVar16 != (char *)0x0) {
                sVar8 = strlen(pcVar16);
                uVar7 = (uint)sVar8 & 0x3fffffff;
              }
              data[uVar14 * 2 + 9] = pcVar15;
              if (1 < pParse->eParseMode) {
                for (pRVar12 = pParse->pRename; pRVar12 != (RenameToken *)0x0;
                    pRVar12 = pRVar12->pNext) {
                  if ((char *)pRVar12->p == pcVar16) {
                    pRVar12->p = pcVar15;
                    break;
                  }
                }
              }
              memcpy(pcVar15,pcVar16,(ulong)uVar7);
              pcVar16 = pcVar15 + uVar7;
              pcVar15 = pcVar16 + 1;
              *pcVar16 = '\0';
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar11);
          }
        }
        else if (0 < (int)uVar11) {
          sVar4 = pTVar6->nCol;
          uVar14 = 0;
LAB_001566ae:
          if (0 < sVar4) {
            pcVar15 = pFromCol->a[uVar14].zEName;
            lVar13 = 0;
LAB_001566c7:
            lVar9 = 0;
            do {
              bVar2 = pTVar6->aCol[lVar13].zCnName[lVar9];
              bVar3 = pcVar15[lVar9];
              if (bVar2 == bVar3) {
                if ((ulong)bVar2 == 0) {
                  *(int *)(ppcVar1 + uVar14 * 2) = (int)lVar13;
                  if ((pParse->eParseMode < 2) ||
                     (pRVar12 = pParse->pRename, pRVar12 == (RenameToken *)0x0)) goto LAB_00156749;
                  goto LAB_00156736;
                }
              }
              else if (""[bVar2] != ""[bVar3]) goto LAB_001566f8;
              lVar9 = lVar9 + 1;
            } while( true );
          }
          uVar14 = 0;
LAB_001568bc:
          sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                          pFromCol->a[uVar14].zEName);
          goto LAB_001568db;
        }
        *(undefined1 *)((long)data + 0x2c) = 0;
        *(char *)((long)data + 0x2d) = (char)flags;
        *(char *)((long)data + 0x2e) = (char)((uint)flags >> 8);
        ppcVar10 = (char **)sqlite3HashInsert(&pTVar6->pSchema->fkeyHash,data[2],data);
        if (ppcVar10 == data) {
          sqlite3OomFault(db);
LAB_001568db:
          sqlite3DbFreeNN(db,data);
        }
        else {
          if (ppcVar10 != (char **)0x0) {
            data[3] = (char *)ppcVar10;
            ppcVar10[4] = (char *)data;
          }
          (pTVar6->u).vtab.azArg = data;
        }
      }
      goto LAB_001564eb;
    }
  }
  if (pToCol == (ExprList *)0x0) {
    return;
  }
LAB_00156500:
  exprListDeleteNN(db,pToCol);
  return;
LAB_001566f8:
  lVar13 = lVar13 + 1;
  if (lVar13 == sVar4) {
    uVar14 = uVar14 & 0xffffffff;
    goto LAB_001568bc;
  }
  goto LAB_001566c7;
  while (pRVar12 = pRVar12->pNext, pRVar12 != (RenameToken *)0x0) {
LAB_00156736:
    if ((char *)pRVar12->p == pcVar15) {
      pRVar12->p = ppcVar1 + uVar14 * 2;
      break;
    }
  }
LAB_00156749:
  uVar14 = uVar14 + 1;
  if (uVar14 == uVar11) goto LAB_00156765;
  goto LAB_001566ae;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  i64 nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zCnName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zEName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  assert( IsOrdinaryTable(p) );
  pFKey->pNextFrom = p->u.tab.pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zCnName, pFromCol->a[i].zEName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse,
          "unknown column \"%s\" in foreign key definition",
          pFromCol->a[i].zEName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zEName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zEName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zEName);
      }
      memcpy(z, pToCol->a[i].zEName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash,
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  assert( IsOrdinaryTable(p) );
  p->u.tab.pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}